

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::EnforceStringStyle::visit(EnforceStringStyle *this,LiteralString *lit)

{
  bool bVar1;
  reference pcVar2;
  long in_RSI;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  *in_RDI;
  bool use_single;
  char32_t c;
  iterator __end2;
  iterator __begin2;
  UString *__range2;
  uint num_double;
  uint num_single;
  UString canonical;
  bool in_stack_000001c7;
  UString *in_stack_000001c8;
  UString *in_stack_00000590;
  LocationRange *in_stack_00000598;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffff70;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffff78;
  bool local_59;
  __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_48;
  undefined1 *local_40;
  int local_38;
  int local_34;
  undefined1 local_30 [8];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffd8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RSI + 0xa0) != 5) {
    if (((*(int *)(in_RSI + 0xa0) != 2) && (*(int *)(in_RSI + 0xa0) != 4)) &&
       (*(int *)(in_RSI + 0xa0) != 3)) {
      jsonnet_string_unescape(in_stack_00000598,in_stack_00000590);
      local_34 = 0;
      local_38 = 0;
      local_40 = local_30;
      local_48._M_current =
           (char32_t *)
           std::__cxx11::
           basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::begin
                     (in_stack_ffffffffffffff78);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      end(in_stack_ffffffffffffff78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                                 *)in_stack_ffffffffffffff70,in_RDI), bVar1) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                 ::operator*(&local_48);
        if (*pcVar2 == L'\'') {
          local_34 = local_34 + 1;
        }
        if (*pcVar2 == L'\"') {
          local_38 = local_38 + 1;
        }
        __gnu_cxx::
        __normal_iterator<char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
        ::operator++(&local_48);
      }
      if ((local_34 == 0) || (local_38 == 0)) {
        local_59 = local_34 == 0 && *(char *)&in_RDI[2]._M_current == 's';
        if (local_38 != 0) {
          local_59 = true;
        }
        jsonnet_string_escape(in_stack_000001c8,in_stack_000001c7);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        std::__cxx11::u32string::~u32string(in_stack_ffffffffffffff70);
        *(uint *)(in_RSI + 0xa0) = (uint)!local_59;
      }
      std::__cxx11::u32string::~u32string(in_stack_ffffffffffffff70);
    }
    return;
  }
  __assert_fail("lit->tokenKind != LiteralString::RAW_DESUGARED",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                ,0x292,"virtual void jsonnet::internal::EnforceStringStyle::visit(LiteralString *)")
  ;
}

Assistant:

void visit(LiteralString *lit)
    {
        assert(lit->tokenKind != LiteralString::RAW_DESUGARED);
        if (lit->tokenKind == LiteralString::BLOCK)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_DOUBLE)
            return;
        if (lit->tokenKind == LiteralString::VERBATIM_SINGLE)
            return;
        UString canonical = jsonnet_string_unescape(lit->location, lit->value);
        unsigned num_single = 0, num_double = 0;
        for (char32_t c : canonical) {
            if (c == '\'')
                num_single++;
            if (c == '"')
                num_double++;
        }
        if (num_single > 0 && num_double > 0)
            return;  // Don't change it.
        bool use_single = opts.stringStyle == 's';
        if (num_single > 0)
            use_single = false;
        if (num_double > 0)
            use_single = true;

        // Change it.
        lit->value = jsonnet_string_escape(canonical, use_single);
        lit->tokenKind = use_single ? LiteralString::SINGLE : LiteralString::DOUBLE;
    }